

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall tinyusdz::MetaVariable::MetaVariable(MetaVariable *this,MetaVariable *rhs)

{
  void *local_20;
  MetaVariable *local_18;
  MetaVariable *rhs_local;
  MetaVariable *this_local;
  
  local_20 = (void *)0x0;
  local_18 = rhs;
  rhs_local = this;
  tinyusdz::value::Value::Value<decltype(nullptr)>(&this->_value,&local_20);
  std::__cxx11::string::string((string *)&this->_name);
  std::__cxx11::string::operator=((string *)&this->_name,(string *)&local_18->_name);
  tinyusdz::value::Value::operator=(&this->_value,&local_18->_value);
  return;
}

Assistant:

MetaVariable(const MetaVariable &rhs) {
    _name = rhs._name;
    _value = rhs._value;
  }